

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char **ppcVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  uint uVar11;
  bool bVar12;
  int iVar13;
  undefined8 uVar14;
  ulong uVar15;
  char *pcVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  filenames_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  filenames_01;
  bool toPly;
  bool format;
  vector<float,_std::allocator<float>_> c;
  string pixelBounds;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  string pixel;
  string pixelMaterial;
  string renderCoordSys;
  string logLevel;
  string cropWindow;
  bool local_1563;
  bool local_1562;
  bool local_1561;
  char **local_1560;
  string local_1558;
  string local_1538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1518;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_14f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1498;
  string local_1478;
  string local_1458;
  string local_1438;
  string local_1418;
  string local_13f8;
  string local_13d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13b8;
  string local_1398;
  string local_1378;
  string local_1358;
  string local_1338;
  string local_1318;
  string local_12f8;
  string local_12d8;
  string local_12b8;
  string local_1298;
  string local_1278;
  string local_1258;
  string local_1238;
  _Any_data local_1218;
  code *local_1208;
  code *local_1200;
  _Any_data local_11f8;
  code *local_11e8;
  code *local_11e0;
  _Any_data local_11d8;
  code *local_11c8;
  code *local_11c0;
  _Any_data local_11b8;
  code *local_11a8;
  code *local_11a0;
  _Any_data local_1198;
  code *local_1188;
  code *local_1180;
  _Any_data local_1178;
  code *local_1168;
  code *local_1160;
  _Any_data local_1158;
  code *local_1148;
  code *local_1140;
  _Any_data local_1138;
  code *local_1128;
  code *local_1120;
  _Any_data local_1118;
  code *local_1108;
  code *local_1100;
  _Any_data local_10f8;
  code *local_10e8;
  code *local_10e0;
  _Any_data local_10d8;
  code *local_10c8;
  code *local_10c0;
  _Any_data local_10b8;
  code *local_10a8;
  code *local_10a0;
  _Any_data local_1098;
  code *local_1088;
  code *local_1080;
  _Any_data local_1078;
  code *local_1068;
  code *local_1060;
  _Any_data local_1058;
  code *local_1048;
  code *local_1040;
  _Any_data local_1038;
  code *local_1028;
  code *local_1020;
  _Any_data local_1018;
  code *local_1008;
  code *local_1000;
  _Any_data local_ff8;
  code *local_fe8;
  code *local_fe0;
  _Any_data local_fd8;
  code *local_fc8;
  code *local_fc0;
  _Any_data local_fb8;
  code *local_fa8;
  code *local_fa0;
  _Any_data local_f98;
  code *local_f88;
  code *local_f80;
  _Any_data local_f78;
  code *local_f68;
  code *local_f60;
  _Any_data local_f58;
  code *local_f48;
  code *local_f40;
  _Any_data local_f38;
  code *local_f28;
  code *local_f20;
  PBRTOptions local_f18;
  undefined1 local_e10 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_df0;
  polymorphic_allocator<pbrt::ParsedParameter_*> local_de0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_dd8;
  undefined1 local_dd0 [64];
  undefined1 local_d90 [48];
  undefined1 local_d60 [32];
  polymorphic_allocator<pbrt::ParsedParameter_*> local_d40;
  
  local_f18.imageFile._M_dataplus._M_p = (pointer)&local_f18.imageFile.field_2;
  local_f18.mseReferenceImage._M_dataplus._M_p = (pointer)&local_f18.mseReferenceImage.field_2;
  local_f18.mseReferenceOutput._M_dataplus._M_p = (pointer)&local_f18.mseReferenceOutput.field_2;
  local_14f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x40;
  local_14f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f18.super_BasicPBRTOptions.useGPU = false;
  local_f18.super_BasicPBRTOptions.seed = 0;
  local_f18.super_BasicPBRTOptions.quiet = false;
  local_f18.super_BasicPBRTOptions.disablePixelJitter = false;
  local_f18.super_BasicPBRTOptions.disableWavelengthJitter = false;
  local_f18.super_BasicPBRTOptions.forceDiffuse = false;
  local_f18.super_BasicPBRTOptions.renderingSpace = CameraWorld;
  local_f18.nThreads = 0;
  local_f18.logLevel = Error;
  local_f18.writePartialImages = false;
  local_f18.recordPixelStatistics = false;
  local_f18.pixelSamples.set = false;
  local_f18.gpuDevice.set = false;
  local_f18.quickRender = false;
  local_f18.upgrade = false;
  local_f18.imageFile._M_string_length = 0;
  local_f18.imageFile.field_2._M_local_buf[0] = '\0';
  local_f18.mseReferenceImage._M_string_length = 0;
  local_f18.mseReferenceImage.field_2._M_local_buf[0] = '\0';
  local_f18.mseReferenceOutput._M_string_length = 0;
  local_f18.mseReferenceOutput.field_2._M_local_buf[0] = '\0';
  local_f18.debugStart._M_dataplus._M_p = (pointer)&local_f18.debugStart.field_2;
  local_13b8._M_dataplus._M_p = (pointer)&local_13b8.field_2;
  local_f18.displayServer._M_dataplus._M_p = (pointer)&local_f18.displayServer.field_2;
  local_f18.debugStart._M_string_length = 0;
  local_f18.debugStart.field_2._M_local_buf[0] = '\0';
  local_f18.displayServer._M_string_length = 0;
  local_f18.displayServer.field_2._M_local_buf[0] = '\0';
  local_f18.cropWindow.set = false;
  local_f18.pixelBounds.set = false;
  local_f18.pixelMaterial.set = false;
  local_1560 = argv;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_13b8,"error","");
  local_1498._M_dataplus._M_p = (pointer)&local_1498.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1498,"cameraworld","");
  local_1561 = false;
  local_1562 = false;
  ppcVar1 = local_1560 + 1;
  pcVar16 = local_1560[1];
  local_1560 = ppcVar1;
  if (pcVar16 != (char *)0x0) {
    do {
      paVar17 = &local_1558.field_2;
      if (*pcVar16 == '-') {
        local_1518._M_dataplus._M_p = (pointer)&local_1518.field_2;
        local_14d8._M_dataplus._M_p = (pointer)&local_14d8.field_2;
        local_14b8._M_dataplus._M_p = (pointer)&local_14b8.field_2;
        local_e10._8_8_ = 0;
        local_e10[0x10] = 0;
        local_1518._M_string_length = 0;
        local_14d8._M_string_length = 0;
        local_14b8._M_string_length = 0;
        local_1518.field_2._M_local_buf[0] = '\0';
        local_14d8.field_2._M_local_buf[0] = '\0';
        local_14b8.field_2._M_local_buf[0] = '\0';
        local_1558._M_dataplus._M_p = (pointer)paVar17;
        local_e10._0_8_ = local_e10 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1558,"cropwindow","");
        local_f38._M_unused._M_object = (void *)0x0;
        local_f38._8_8_ = 0;
        local_f20 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                    ::_M_invoke;
        local_f28 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                    ::_M_manager;
        bVar12 = pbrt::ParseArg<std::__cxx11::string*>
                           (&local_1560,&local_1558,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_e10,
                            (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                             *)&local_f38);
        if (local_f28 != (code *)0x0) {
          (*local_f28)(&local_f38,&local_f38,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1558._M_dataplus._M_p != paVar17) {
          operator_delete(local_1558._M_dataplus._M_p,
                          CONCAT71(local_1558.field_2._M_allocated_capacity._1_7_,
                                   local_1558.field_2._M_local_buf[0]) + 1);
        }
        if (bVar12) {
          str._M_str = (char *)local_e10._0_8_;
          str._M_len = local_e10._8_8_;
          pbrt::SplitStringToFloats((vector<float,_std::allocator<float>_> *)&local_1538,str,',');
          if (local_1538._M_string_length - (long)local_1538._M_dataplus._M_p == 0x10) {
            auVar8 = vminss_avx(ZEXT416(*(uint *)(local_1538._M_dataplus._M_p + 4)),
                                ZEXT416(*(uint *)local_1538._M_dataplus._M_p));
            auVar9 = vminss_avx(ZEXT416(*(uint *)(local_1538._M_dataplus._M_p + 0xc)),
                                ZEXT416(*(uint *)(local_1538._M_dataplus._M_p + 8)));
            auVar6 = vmaxss_avx(ZEXT416(*(uint *)(local_1538._M_dataplus._M_p + 4)),
                                ZEXT416(*(uint *)local_1538._M_dataplus._M_p));
            auVar7 = vmaxss_avx(ZEXT416(*(uint *)(local_1538._M_dataplus._M_p + 0xc)),
                                ZEXT416(*(uint *)(local_1538._M_dataplus._M_p + 8)));
            auVar8 = vinsertps_avx(auVar8,auVar9,0x10);
            auVar6 = vinsertps_avx(auVar6,auVar7,0x10);
            local_f18.cropWindow.optionalValue =
                 (aligned_storage_t<sizeof(pbrt::Bounds2<float>),_alignof(pbrt::Bounds2<float>)>)
                 vmovlhps_avx(auVar8,auVar6);
            local_f18.cropWindow.set = true;
LAB_001d0a71:
            operator_delete(local_1538._M_dataplus._M_p,
                            local_1538.field_2._M_allocated_capacity -
                            (long)local_1538._M_dataplus._M_p);
LAB_001d0a7e:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_14b8._M_dataplus._M_p != &local_14b8.field_2) {
              operator_delete(local_14b8._M_dataplus._M_p,
                              CONCAT71(local_14b8.field_2._M_allocated_capacity._1_7_,
                                       local_14b8.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_14d8._M_dataplus._M_p != &local_14d8.field_2) {
              operator_delete(local_14d8._M_dataplus._M_p,
                              CONCAT71(local_14d8.field_2._M_allocated_capacity._1_7_,
                                       local_14d8.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1518._M_dataplus._M_p != &local_1518.field_2) {
              operator_delete(local_1518._M_dataplus._M_p,
                              CONCAT71(local_1518.field_2._M_allocated_capacity._1_7_,
                                       local_1518.field_2._M_local_buf[0]) + 1);
            }
            if ((undefined1 *)local_e10._0_8_ != local_e10 + 0x10) {
              operator_delete((void *)local_e10._0_8_,
                              CONCAT62(local_e10._18_6_,CONCAT11(local_e10[0x11],local_e10[0x10])) +
                              1);
            }
            goto LAB_001d0b06;
          }
          local_1558._M_dataplus._M_p = (pointer)paVar17;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1558,"Didn\'t find four values after --cropwindow","");
        }
        else {
          local_1558._M_dataplus._M_p = (pointer)paVar17;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1558,"pixel","");
          local_f58 = (_Any_data)(ZEXT816(0) << 0x40);
          local_f40 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                      ::_M_invoke;
          local_f48 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                      ::_M_manager;
          bVar12 = pbrt::ParseArg<std::__cxx11::string*>
                             (&local_1560,&local_1558,&local_14d8,
                              (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                               *)&local_f58);
          if (local_f48 != (code *)0x0) {
            (*local_f48)(&local_f58,&local_f58,__destroy_functor);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1558._M_dataplus._M_p != paVar17) {
            operator_delete(local_1558._M_dataplus._M_p,
                            CONCAT71(local_1558.field_2._M_allocated_capacity._1_7_,
                                     local_1558.field_2._M_local_buf[0]) + 1);
          }
          if (bVar12) {
            str_00._M_str = local_14d8._M_dataplus._M_p;
            str_00._M_len = local_14d8._M_string_length;
            pbrt::SplitStringToInts((vector<int,_std::allocator<int>_> *)&local_1538,str_00,',');
            if (local_1538._M_string_length - (long)local_1538._M_dataplus._M_p == 8) {
              local_f18.pixelBounds.optionalValue._0_8_ = *(undefined8 *)local_1538._M_dataplus._M_p
              ;
              local_f18.pixelBounds.optionalValue._8_8_ =
                   CONCAT44(*(uint *)(local_1538._M_dataplus._M_p + 4) + 1,
                            *(uint *)local_1538._M_dataplus._M_p + 1);
LAB_001d0a61:
              local_f18.pixelBounds.set = true;
              goto LAB_001d0a71;
            }
            local_1558._M_dataplus._M_p = (pointer)paVar17;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1558,"Didn\'t find two values after --pixel","");
          }
          else {
            local_1558._M_dataplus._M_p = (pointer)paVar17;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1558,"pixelbounds","");
            local_f78 = (_Any_data)(ZEXT816(0) << 0x40);
            local_f60 = std::
                        _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                        ::_M_invoke;
            local_f68 = std::
                        _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                        ::_M_manager;
            bVar12 = pbrt::ParseArg<std::__cxx11::string*>
                               (&local_1560,&local_1558,&local_1518,
                                (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                 *)&local_f78);
            if (local_f68 != (code *)0x0) {
              (*local_f68)(&local_f78,&local_f78,__destroy_functor);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1558._M_dataplus._M_p != paVar17) {
              operator_delete(local_1558._M_dataplus._M_p,
                              CONCAT71(local_1558.field_2._M_allocated_capacity._1_7_,
                                       local_1558.field_2._M_local_buf[0]) + 1);
            }
            if (bVar12) {
              str_01._M_str = local_1518._M_dataplus._M_p;
              str_01._M_len = local_1518._M_string_length;
              pbrt::SplitStringToInts((vector<int,_std::allocator<int>_> *)&local_1538,str_01,',');
              if (local_1538._M_string_length - (long)local_1538._M_dataplus._M_p == 0x10) {
                uVar2 = *(uint *)local_1538._M_dataplus._M_p;
                uVar3 = *(uint *)(local_1538._M_dataplus._M_p + 4);
                uVar4 = *(uint *)(local_1538._M_dataplus._M_p + 8);
                uVar5 = *(uint *)(local_1538._M_dataplus._M_p + 0xc);
                uVar10 = uVar2;
                if ((int)uVar3 < (int)uVar2) {
                  uVar10 = uVar3;
                }
                uVar11 = uVar4;
                if ((int)uVar5 < (int)uVar4) {
                  uVar11 = uVar5;
                }
                local_f18.pixelBounds.optionalValue._0_8_ = CONCAT44(uVar11,uVar10);
                if ((int)uVar3 < (int)uVar2) {
                  uVar3 = uVar2;
                }
                if ((int)uVar5 < (int)uVar4) {
                  uVar5 = uVar4;
                }
                local_f18.pixelBounds.optionalValue._8_8_ = CONCAT44(uVar5,uVar3);
                goto LAB_001d0a61;
              }
              local_1558._M_dataplus._M_p = (pointer)paVar17;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1558,
                         "Didn\'t find four integer values after --pixelbounds","");
            }
            else {
              local_1558._M_dataplus._M_p = (pointer)paVar17;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1558,"pixelmaterial","");
              local_f98 = (_Any_data)(ZEXT816(0) << 0x40);
              local_f80 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                          ::_M_invoke;
              local_f88 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                          ::_M_manager;
              bVar12 = pbrt::ParseArg<std::__cxx11::string*>
                                 (&local_1560,&local_1558,&local_14b8,
                                  (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                   *)&local_f98);
              if (local_f88 != (code *)0x0) {
                (*local_f88)(&local_f98,&local_f98,__destroy_functor);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1558._M_dataplus._M_p != paVar17) {
                operator_delete(local_1558._M_dataplus._M_p,
                                CONCAT71(local_1558.field_2._M_allocated_capacity._1_7_,
                                         local_1558.field_2._M_local_buf[0]) + 1);
              }
              if (bVar12) {
                str_02._M_str = local_14b8._M_dataplus._M_p;
                str_02._M_len = local_14b8._M_string_length;
                pbrt::SplitStringToInts((vector<int,_std::allocator<int>_> *)&local_1538,str_02,',')
                ;
                if (local_1538._M_string_length - (long)local_1538._M_dataplus._M_p == 8) {
                  local_f18.pixelMaterial.optionalValue =
                       *(aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> *)
                        local_1538._M_dataplus._M_p;
                  local_f18.pixelMaterial.set = true;
                  goto LAB_001d0a71;
                }
                local_1558._M_dataplus._M_p = (pointer)paVar17;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1558,"Didn\'t find two values after --pixelmaterial","")
                ;
              }
              else {
                local_1558._M_dataplus._M_p = (pointer)paVar17;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1558,"debugstart","");
                local_fb8 = (_Any_data)(ZEXT816(0) << 0x40);
                local_fa0 = std::
                            _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                            ::_M_invoke;
                local_fa8 = std::
                            _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                            ::_M_manager;
                bVar12 = pbrt::ParseArg<std::__cxx11::string*>
                                   (&local_1560,&local_1558,&local_f18.debugStart,
                                    (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                     *)&local_fb8);
                local_1563 = true;
                if (!bVar12) {
                  local_1538._M_dataplus._M_p = (pointer)&local_1538.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1538,"disable-pixel-jitter","");
                  local_fd8 = (_Any_data)(ZEXT816(0) << 0x40);
                  local_fc0 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                              ::_M_invoke;
                  local_fc8 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                              ::_M_manager;
                  bVar12 = pbrt::ParseArg<bool*>
                                     (&local_1560,&local_1538,
                                      &local_f18.super_BasicPBRTOptions.disablePixelJitter,
                                      (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                       *)&local_fd8);
                  local_1563 = true;
                  if (!bVar12) {
                    local_1238._M_dataplus._M_p = (pointer)&local_1238.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_1238,"disable-wavelength-jitter","");
                    local_ff8 = (_Any_data)(ZEXT816(0) << 0x40);
                    local_fe0 = std::
                                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                ::_M_invoke;
                    local_fe8 = std::
                                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                ::_M_manager;
                    bVar12 = pbrt::ParseArg<bool*>
                                       (&local_1560,&local_1238,
                                        &local_f18.super_BasicPBRTOptions.disableWavelengthJitter,
                                        (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                         *)&local_ff8);
                    local_1563 = true;
                    if (!bVar12) {
                      local_1258._M_dataplus._M_p = (pointer)&local_1258.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_1258,"display-server","");
                      local_1018 = (_Any_data)(ZEXT816(0) << 0x40);
                      local_1000 = std::
                                   _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                   ::_M_invoke;
                      local_1008 = std::
                                   _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                   ::_M_manager;
                      bVar12 = pbrt::ParseArg<std::__cxx11::string*>
                                         (&local_1560,&local_1258,&local_f18.displayServer,
                                          (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                           *)&local_1018);
                      local_1563 = true;
                      if (!bVar12) {
                        local_1278._M_dataplus._M_p = (pointer)&local_1278.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_1278,"force-diffuse","");
                        local_1038 = (_Any_data)(ZEXT816(0) << 0x40);
                        local_1020 = std::
                                     _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                     ::_M_invoke;
                        local_1028 = std::
                                     _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                     ::_M_manager;
                        bVar12 = pbrt::ParseArg<bool*>
                                           (&local_1560,&local_1278,
                                            &local_f18.super_BasicPBRTOptions.forceDiffuse,
                                            (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                             *)&local_1038);
                        local_1563 = true;
                        if (!bVar12) {
                          local_1298._M_dataplus._M_p = (pointer)&local_1298.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_1298,"format","");
                          local_1058 = (_Any_data)(ZEXT816(0) << 0x40);
                          local_1040 = std::
                                       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                       ::_M_invoke;
                          local_1048 = std::
                                       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                       ::_M_manager;
                          bVar12 = pbrt::ParseArg<bool*>
                                             (&local_1560,&local_1298,&local_1561,
                                              (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                               *)&local_1058);
                          local_1563 = true;
                          if (!bVar12) {
                            local_12b8._M_dataplus._M_p = (pointer)&local_12b8.field_2;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_12b8,"log-level","");
                            local_1078 = (_Any_data)(ZEXT816(0) << 0x40);
                            local_1060 = std::
                                         _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                         ::_M_invoke;
                            local_1068 = std::
                                         _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                         ::_M_manager;
                            bVar12 = pbrt::ParseArg<std::__cxx11::string*>
                                               (&local_1560,&local_12b8,&local_13b8,
                                                (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                 *)&local_1078);
                            local_1563 = true;
                            if (!bVar12) {
                              local_12d8._M_dataplus._M_p = (pointer)&local_12d8.field_2;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_12d8,"mse-reference-image","");
                              local_1098 = (_Any_data)(ZEXT816(0) << 0x40);
                              local_1080 = std::
                                           _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                           ::_M_invoke;
                              local_1088 = std::
                                           _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                           ::_M_manager;
                              bVar12 = pbrt::ParseArg<std::__cxx11::string*>
                                                 (&local_1560,&local_12d8,
                                                  &local_f18.mseReferenceImage,
                                                  (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)&local_1098);
                              local_1563 = true;
                              if (!bVar12) {
                                local_12f8._M_dataplus._M_p = (pointer)&local_12f8.field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_12f8,"mse-reference-out","");
                                local_10b8 = (_Any_data)(ZEXT816(0) << 0x40);
                                local_10a0 = std::
                                             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                             ::_M_invoke;
                                local_10a8 = std::
                                             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                             ::_M_manager;
                                bVar12 = pbrt::ParseArg<std::__cxx11::string*>
                                                   (&local_1560,&local_12f8,
                                                    &local_f18.mseReferenceOutput,
                                                    (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)&local_10b8);
                                local_1563 = true;
                                if (!bVar12) {
                                  local_1318._M_dataplus._M_p = (pointer)&local_1318.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_1318,"nthreads","");
                                  local_10d8 = (_Any_data)(ZEXT816(0) << 0x40);
                                  local_10c0 = std::
                                               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                               ::_M_invoke;
                                  local_10c8 = std::
                                               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                               ::_M_manager;
                                  bVar12 = pbrt::ParseArg<int*>
                                                     (&local_1560,&local_1318,&local_f18.nThreads,
                                                      (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)&local_10d8);
                                  local_1563 = true;
                                  if (!bVar12) {
                                    local_1338._M_dataplus._M_p = (pointer)&local_1338.field_2;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)&local_1338,"outfile","");
                                    local_10f8 = (_Any_data)(ZEXT816(0) << 0x40);
                                    local_10e0 = std::
                                                 _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                 ::_M_invoke;
                                    local_10e8 = std::
                                                 _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                 ::_M_manager;
                                    bVar12 = pbrt::ParseArg<std::__cxx11::string*>
                                                       (&local_1560,&local_1338,&local_f18.imageFile
                                                        ,(
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)&local_10f8);
                                    local_1563 = true;
                                    if (!bVar12) {
                                      local_1358._M_dataplus._M_p = (pointer)&local_1358.field_2;
                                      std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)&local_1358,"pixelstats","");
                                      local_1118 = (_Any_data)(ZEXT816(0) << 0x40);
                                      local_1100 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_invoke;
                                      local_1108 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_manager;
                                      bVar12 = pbrt::ParseArg<bool*>
                                                         (&local_1560,&local_1358,
                                                          &local_f18.recordPixelStatistics,
                                                          (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)&local_1118);
                                      local_1563 = true;
                                      if (!bVar12) {
                                        local_1378._M_dataplus._M_p = (pointer)&local_1378.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_1378,"quick","");
                                        local_1138 = (_Any_data)(ZEXT816(0) << 0x40);
                                        local_1120 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_invoke;
                                        local_1128 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_manager;
                                        bVar12 = pbrt::ParseArg<bool*>
                                                           (&local_1560,&local_1378,
                                                            &local_f18.quickRender,
                                                            (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)&local_1138);
                                        local_1563 = true;
                                        if (!bVar12) {
                                          local_1398._M_dataplus._M_p = (pointer)&local_1398.field_2
                                          ;
                                          std::__cxx11::string::_M_construct<char_const*>
                                                    ((string *)&local_1398,"quiet","");
                                          local_1158 = (_Any_data)(ZEXT816(0) << 0x40);
                                          local_1140 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_invoke;
                                          local_1148 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_manager;
                                          bVar12 = pbrt::ParseArg<bool*>
                                                             (&local_1560,&local_1398,
                                                              &local_f18.super_BasicPBRTOptions.
                                                               quiet,(
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)&local_1158);
                                          local_1563 = true;
                                          if (!bVar12) {
                                            local_13d8._M_dataplus._M_p =
                                                 (pointer)&local_13d8.field_2;
                                            std::__cxx11::string::_M_construct<char_const*>
                                                      ((string *)&local_13d8,"render-coord-sys","");
                                            local_1178 = (_Any_data)(ZEXT816(0) << 0x40);
                                            local_1160 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_invoke;
                                            local_1168 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_manager;
                                            bVar12 = pbrt::ParseArg<std::__cxx11::string*>
                                                               (&local_1560,&local_13d8,&local_1498,
                                                                (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)&local_1178);
                                            local_1563 = true;
                                            if (!bVar12) {
                                              local_13f8._M_dataplus._M_p =
                                                   (pointer)&local_13f8.field_2;
                                              std::__cxx11::string::_M_construct<char_const*>
                                                        ((string *)&local_13f8,"seed","");
                                              local_1198 = (_Any_data)(ZEXT816(0) << 0x40);
                                              local_1180 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_invoke;
                                              local_1188 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_manager;
                                              bVar12 = pbrt::ParseArg<int*>
                                                                 (&local_1560,&local_13f8,
                                                                  (int *)&local_f18,
                                                                  (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)&local_1198);
                                              local_1563 = true;
                                              if (!bVar12) {
                                                local_1418._M_dataplus._M_p =
                                                     (pointer)&local_1418.field_2;
                                                std::__cxx11::string::_M_construct<char_const*>
                                                          ((string *)&local_1418,"spp","");
                                                local_11b8 = (_Any_data)(ZEXT816(0) << 0x40);
                                                local_11a0 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_invoke;
                                                local_11a8 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_manager;
                                                bVar12 = pbrt::ParseArg<pstd::optional<int>*>
                                                                   (&local_1560,&local_1418,
                                                                    &local_f18.pixelSamples,
                                                                    (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)&local_11b8);
                                                local_1563 = true;
                                                if (!bVar12) {
                                                  local_1438._M_dataplus._M_p =
                                                       (pointer)&local_1438.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_1438,"toply","");
                                                  local_11d8 = (_Any_data)(ZEXT816(0) << 0x40);
                                                  local_11c0 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_invoke;
                                                  local_11c8 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_manager;
                                                  bVar12 = pbrt::ParseArg<bool*>
                                                                     (&local_1560,&local_1438,
                                                                      &local_1562,
                                                                      (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)&local_11d8);
                                                  local_1563 = true;
                                                  if (!bVar12) {
                                                    local_1458._M_dataplus._M_p =
                                                         (pointer)&local_1458.field_2;
                                                    std::__cxx11::string::_M_construct<char_const*>
                                                              ((string *)&local_1458,
                                                               "write-partial-images","");
                                                    local_11f8 = (_Any_data)(ZEXT816(0) << 0x40);
                                                    local_11e0 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_invoke;
                                                  local_11e8 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_manager;
                                                  bVar12 = pbrt::ParseArg<bool*>
                                                                     (&local_1560,&local_1458,
                                                                      &local_f18.writePartialImages,
                                                                      (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)&local_11f8);
                                                  local_1563 = true;
                                                  if (!bVar12) {
                                                    local_1478._M_dataplus._M_p =
                                                         (pointer)&local_1478.field_2;
                                                    std::__cxx11::string::_M_construct<char_const*>
                                                              ((string *)&local_1478,"upgrade","");
                                                    local_1218 = (_Any_data)(ZEXT816(0) << 0x40);
                                                    local_1200 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_invoke;
                                                  local_1208 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                                  ::_M_manager;
                                                  local_1563 = pbrt::ParseArg<bool*>
                                                                         (&local_1560,&local_1478,
                                                                          &local_f18.upgrade,
                                                                          (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)&local_1218);
                                                  if (local_1208 != (code *)0x0) {
                                                    (*local_1208)(&local_1218,&local_1218,
                                                                  __destroy_functor);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_1478._M_dataplus._M_p !=
                                                  &local_1478.field_2) {
                                                    operator_delete(local_1478._M_dataplus._M_p,
                                                                    local_1478.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  }
                                                  if (local_11e8 != (code *)0x0) {
                                                    (*local_11e8)(&local_11f8,&local_11f8,
                                                                  __destroy_functor);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_1458._M_dataplus._M_p !=
                                                  &local_1458.field_2) {
                                                    operator_delete(local_1458._M_dataplus._M_p,
                                                                    local_1458.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  }
                                                  if (local_11c8 != (code *)0x0) {
                                                    (*local_11c8)(&local_11d8,&local_11d8,
                                                                  __destroy_functor);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_1438._M_dataplus._M_p !=
                                                  &local_1438.field_2) {
                                                    operator_delete(local_1438._M_dataplus._M_p,
                                                                    local_1438.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                }
                                                if (local_11a8 != (code *)0x0) {
                                                  (*local_11a8)(&local_11b8,&local_11b8,
                                                                __destroy_functor);
                                                }
                                                if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_1418._M_dataplus._M_p !=
                                                  &local_1418.field_2) {
                                                  operator_delete(local_1418._M_dataplus._M_p,
                                                                  local_1418.field_2.
                                                                  _M_allocated_capacity + 1);
                                                }
                                              }
                                              if (local_1188 != (code *)0x0) {
                                                (*local_1188)(&local_1198,&local_1198,
                                                              __destroy_functor);
                                              }
                                              if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_13f8._M_dataplus._M_p !=
                                                  &local_13f8.field_2) {
                                                operator_delete(local_13f8._M_dataplus._M_p,
                                                                local_13f8.field_2.
                                                                _M_allocated_capacity + 1);
                                              }
                                            }
                                            if (local_1168 != (code *)0x0) {
                                              (*local_1168)(&local_1178,&local_1178,
                                                            __destroy_functor);
                                            }
                                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_13d8._M_dataplus._M_p !=
                                                &local_13d8.field_2) {
                                              operator_delete(local_13d8._M_dataplus._M_p,
                                                              local_13d8.field_2.
                                                              _M_allocated_capacity + 1);
                                            }
                                          }
                                          if (local_1148 != (code *)0x0) {
                                            (*local_1148)(&local_1158,&local_1158,__destroy_functor)
                                            ;
                                          }
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)local_1398._M_dataplus._M_p != &local_1398.field_2)
                                          {
                                            operator_delete(local_1398._M_dataplus._M_p,
                                                            local_1398.field_2._M_allocated_capacity
                                                            + 1);
                                          }
                                        }
                                        if (local_1128 != (code *)0x0) {
                                          (*local_1128)(&local_1138,&local_1138,__destroy_functor);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_1378._M_dataplus._M_p != &local_1378.field_2) {
                                          operator_delete(local_1378._M_dataplus._M_p,
                                                          local_1378.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                      }
                                      if (local_1108 != (code *)0x0) {
                                        (*local_1108)(&local_1118,&local_1118,__destroy_functor);
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_1358._M_dataplus._M_p != &local_1358.field_2) {
                                        operator_delete(local_1358._M_dataplus._M_p,
                                                        local_1358.field_2._M_allocated_capacity + 1
                                                       );
                                      }
                                    }
                                    if (local_10e8 != (code *)0x0) {
                                      (*local_10e8)(&local_10f8,&local_10f8,__destroy_functor);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_1338._M_dataplus._M_p != &local_1338.field_2) {
                                      operator_delete(local_1338._M_dataplus._M_p,
                                                      local_1338.field_2._M_allocated_capacity + 1);
                                    }
                                  }
                                  if (local_10c8 != (code *)0x0) {
                                    (*local_10c8)(&local_10d8,&local_10d8,__destroy_functor);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_1318._M_dataplus._M_p != &local_1318.field_2) {
                                    operator_delete(local_1318._M_dataplus._M_p,
                                                    local_1318.field_2._M_allocated_capacity + 1);
                                  }
                                }
                                if (local_10a8 != (code *)0x0) {
                                  (*local_10a8)(&local_10b8,&local_10b8,__destroy_functor);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_12f8._M_dataplus._M_p != &local_12f8.field_2) {
                                  operator_delete(local_12f8._M_dataplus._M_p,
                                                  local_12f8.field_2._M_allocated_capacity + 1);
                                }
                              }
                              if (local_1088 != (code *)0x0) {
                                (*local_1088)(&local_1098,&local_1098,__destroy_functor);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_12d8._M_dataplus._M_p != &local_12d8.field_2) {
                                operator_delete(local_12d8._M_dataplus._M_p,
                                                local_12d8.field_2._M_allocated_capacity + 1);
                              }
                            }
                            if (local_1068 != (code *)0x0) {
                              (*local_1068)(&local_1078,&local_1078,__destroy_functor);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_12b8._M_dataplus._M_p != &local_12b8.field_2) {
                              operator_delete(local_12b8._M_dataplus._M_p,
                                              local_12b8.field_2._M_allocated_capacity + 1);
                            }
                          }
                          if (local_1048 != (code *)0x0) {
                            (*local_1048)(&local_1058,&local_1058,__destroy_functor);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_1298._M_dataplus._M_p != &local_1298.field_2) {
                            operator_delete(local_1298._M_dataplus._M_p,
                                            local_1298.field_2._M_allocated_capacity + 1);
                          }
                        }
                        if (local_1028 != (code *)0x0) {
                          (*local_1028)(&local_1038,&local_1038,__destroy_functor);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1278._M_dataplus._M_p != &local_1278.field_2) {
                          operator_delete(local_1278._M_dataplus._M_p,
                                          local_1278.field_2._M_allocated_capacity + 1);
                        }
                      }
                      if (local_1008 != (code *)0x0) {
                        (*local_1008)(&local_1018,&local_1018,__destroy_functor);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1258._M_dataplus._M_p != &local_1258.field_2) {
                        operator_delete(local_1258._M_dataplus._M_p,
                                        local_1258.field_2._M_allocated_capacity + 1);
                      }
                    }
                    if (local_fe8 != (code *)0x0) {
                      (*local_fe8)(&local_ff8,&local_ff8,__destroy_functor);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1238._M_dataplus._M_p != &local_1238.field_2) {
                      operator_delete(local_1238._M_dataplus._M_p,
                                      local_1238.field_2._M_allocated_capacity + 1);
                    }
                  }
                  if (local_fc8 != (code *)0x0) {
                    (*local_fc8)(&local_fd8,&local_fd8,__destroy_functor);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1538._M_dataplus._M_p != &local_1538.field_2) {
                    operator_delete(local_1538._M_dataplus._M_p,
                                    local_1538.field_2._M_allocated_capacity + 1);
                  }
                }
                paVar17 = &local_1558.field_2;
                if (local_fa8 != (code *)0x0) {
                  (*local_fa8)(&local_fb8,&local_fb8,__destroy_functor);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1558._M_dataplus._M_p != paVar17) {
                  operator_delete(local_1558._M_dataplus._M_p,
                                  CONCAT71(local_1558.field_2._M_allocated_capacity._1_7_,
                                           local_1558.field_2._M_local_buf[0]) + 1);
                }
                ppcVar1 = local_1560;
                if (local_1563 != false) goto LAB_001d0a7e;
                pcVar16 = *local_1560;
                iVar13 = strcmp(pcVar16,"--help");
                if (((iVar13 == 0) || (iVar13 = strcmp(pcVar16,"-help"), iVar13 == 0)) ||
                   ((*pcVar16 == '-' && ((pcVar16[1] == 'h' && (pcVar16[2] == '\0')))))) {
                  local_1558._M_string_length = 0;
                  local_1558.field_2._M_local_buf[0] = '\0';
                  local_1558._M_dataplus._M_p = (pointer)paVar17;
                  usage(&local_1558);
                  break;
                }
                local_1558._M_string_length = 0;
                local_1558.field_2._M_local_buf[0] = '\0';
                local_1558._M_dataplus._M_p = (pointer)paVar17;
                pbrt::detail::stringPrintfRecursive<char*&>
                          (&local_1558,"argument \"%s\" unknown",ppcVar1);
              }
            }
          }
        }
        usage(&local_1558);
        goto LAB_001d20fe;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_e10,*local_1560,(allocator<char> *)&local_1518);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_14f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e10);
      if ((undefined1 *)local_e10._0_8_ != local_e10 + 0x10) {
        operator_delete((void *)local_e10._0_8_,
                        CONCAT62(local_e10._18_6_,CONCAT11(local_e10[0x11],local_e10[0x10])) + 1);
      }
      local_1560 = local_1560 + 1;
LAB_001d0b06:
      pcVar16 = *local_1560;
    } while (pcVar16 != (char *)0x0);
  }
  if ((((local_f18.super_BasicPBRTOptions.quiet == false) && (local_1561 == false)) &&
      (local_1562 == false)) && (local_f18.upgrade == false)) {
    printf("pbrt version 4 (built %s at %s)\n","May  3 2025","00:08:40");
    puts("Copyright (c)1998-2020 Matt Pharr, Wenzel Jakob, and Greg Humphreys.");
    puts(
        "The source code to pbrt (but *not* the book contents) is covered by the Apache 2.0 License."
        );
    puts("See the file LICENSE.txt for the conditions of the license.");
    fflush(_stdout);
  }
  iVar13 = std::__cxx11::string::compare((char *)&local_1498);
  if (iVar13 == 0) {
    uVar14 = 0;
  }
  else {
    iVar13 = std::__cxx11::string::compare((char *)&local_1498);
    if (iVar13 == 0) {
      uVar14 = 1;
    }
    else {
      iVar13 = std::__cxx11::string::compare((char *)&local_1498);
      uVar14 = 2;
      if (iVar13 != 0) {
        pbrt::ErrorExit<std::__cxx11::string&>
                  ("%s: unknown rendering coordinate system.",&local_1498);
      }
    }
  }
  local_f18.super_BasicPBRTOptions.renderingSpace = (RenderingCoordinateSystem)uVar14;
  if (local_f18.mseReferenceImage._M_string_length == 0) {
    if (local_f18.mseReferenceOutput._M_string_length != 0) {
LAB_001d20fe:
      pcVar16 = "Must provide MSE reference image via --mse-reference-image";
      goto LAB_001d2105;
    }
  }
  else if (local_f18.mseReferenceOutput._M_string_length == 0) {
    pcVar16 = "Must provide MSE reference output filename via --mse-reference-out";
LAB_001d2105:
    pbrt::ErrorExit<>(pcVar16);
  }
  if ((local_f18.pixelMaterial.set == true) && (local_f18.super_BasicPBRTOptions.useGPU == true)) {
    local_e10._8_8_ = 0;
    local_e10[0x10] = 0;
    local_e10._0_8_ = local_e10 + 0x10;
    pbrt::detail::stringPrintfRecursive
              ((string *)local_e10,"Disabling --use-gpu since --pixelmaterial was specified.");
    pbrt::Warning((FileLoc *)0x0,(char *)local_e10._0_8_);
    if ((undefined1 *)local_e10._0_8_ != local_e10 + 0x10) {
      operator_delete((void *)local_e10._0_8_,
                      CONCAT62(local_e10._18_6_,CONCAT11(local_e10[0x11],local_e10[0x10])) + 1);
    }
    local_f18.super_BasicPBRTOptions.useGPU = false;
  }
  local_f18.logLevel = pbrt::LogLevelFromString(&local_13b8);
  pbrt::InitPBRT(&local_f18);
  if (local_1561 == true) {
    uVar15 = (ulong)local_f18.upgrade;
  }
  else {
    uVar15 = CONCAT71((int7)((ulong)uVar14 >> 8),local_f18.upgrade);
    if (((local_1562 & 1U) == 0) && ((local_f18._44_2_ & 0x100) == 0)) {
      pbrt::ParsedScene::ParsedScene((ParsedScene *)local_e10);
      filenames_01.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)local_14f8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_14f8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5);
      filenames_01.n = uVar15;
      pbrt::ParseFiles((pbrt *)local_e10,
                       (SceneRepresentation *)
                       local_14f8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,filenames_01);
      if (local_f18.super_BasicPBRTOptions.useGPU == true) {
        pbrt::ErrorExit<>("GPU rendering is not supported on this system.");
      }
      pbrt::CPURender((ParsedScene *)local_e10);
      if (pbrt::LOGGING_LogLevel < 1) {
        local_14d8._M_dataplus._M_p = (pointer)pbrt::GetCurrentRSS();
        local_1518._M_string_length = 0;
        local_1518.field_2._M_local_buf[0] = '\0';
        local_1518._M_dataplus._M_p = (pointer)&local_1518.field_2;
        pbrt::detail::stringPrintfRecursive<unsigned_long>
                  (&local_1518,"Memory used after post-render cleanup: %s",
                   (unsigned_long *)&local_14d8);
        pbrt::Log(Verbose,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp"
                  ,0x101,local_1518._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1518._M_dataplus._M_p != &local_1518.field_2) {
          operator_delete(local_1518._M_dataplus._M_p,
                          CONCAT71(local_1518.field_2._M_allocated_capacity._1_7_,
                                   local_1518.field_2._M_local_buf[0]) + 1);
        }
      }
      pbrt::CleanupPBRT();
      pbrt::ParsedScene::~ParsedScene((ParsedScene *)local_e10);
      goto LAB_001d1e5d;
    }
  }
  local_de0.memoryResource = (memory_resource *)&local_df0;
  local_e10._0_8_ = &PTR_Scale_02d9b818;
  local_e10._8_8_ = ((ulong)local_e10._8_8_ >> 8 & 0xffffff) << 8;
  local_e10[0x10] = local_1562;
  local_e10[0x11] = (undefined1)uVar15;
  local_dd0._32_8_ = local_dd0 + 0x10;
  local_df0._M_allocated_capacity._0_4_ = 0;
  local_df0._8_8_ = 0;
  local_dd0._0_8_ = (ParsedParameter *)0x0;
  local_d90._16_8_ = local_d90;
  local_dd0._16_4_ = _S_red;
  local_dd0._24_8_ = (ParsedParameter *)0x0;
  local_dd0._48_8_ = (ParsedParameter *)0x0;
  local_d60._16_8_ = local_d60;
  local_d90._0_4_ = _S_red;
  local_d90._8_8_ = (_Base_ptr)0x0;
  local_d90._32_8_ = (char *)0x0;
  local_d60._0_4_ = _S_red;
  local_d60._8_8_ = (_Base_ptr)0x0;
  local_d40.memoryResource = (memory_resource *)0x0;
  filenames_00.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)local_14f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_14f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5);
  filenames_00.n = local_d60._16_8_;
  local_dd8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_de0.memoryResource;
  local_dd0._40_8_ = local_dd0._32_8_;
  local_d90._24_8_ = local_d90._16_8_;
  local_d60._24_8_ = local_d60._16_8_;
  pbrt::ParseFiles((pbrt *)local_e10,
                   (SceneRepresentation *)
                   local_14f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,filenames_00);
  pbrt::FormattingScene::~FormattingScene((FormattingScene *)local_e10);
LAB_001d1e5d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1498._M_dataplus._M_p != &local_1498.field_2) {
    operator_delete(local_1498._M_dataplus._M_p,local_1498.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13b8._M_dataplus._M_p != &local_13b8.field_2) {
    operator_delete(local_13b8._M_dataplus._M_p,local_13b8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_14f8);
  if (local_f18.pixelMaterial.set == true) {
    local_f18.pixelMaterial.set = false;
  }
  if (local_f18.pixelBounds.set == true) {
    local_f18.pixelBounds.set = false;
  }
  if (local_f18.cropWindow.set == true) {
    local_f18.cropWindow.set = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f18.displayServer._M_dataplus._M_p != &local_f18.displayServer.field_2) {
    operator_delete(local_f18.displayServer._M_dataplus._M_p,
                    CONCAT71(local_f18.displayServer.field_2._M_allocated_capacity._1_7_,
                             local_f18.displayServer.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f18.debugStart._M_dataplus._M_p != &local_f18.debugStart.field_2) {
    operator_delete(local_f18.debugStart._M_dataplus._M_p,
                    CONCAT71(local_f18.debugStart.field_2._M_allocated_capacity._1_7_,
                             local_f18.debugStart.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f18.mseReferenceOutput._M_dataplus._M_p != &local_f18.mseReferenceOutput.field_2) {
    operator_delete(local_f18.mseReferenceOutput._M_dataplus._M_p,
                    CONCAT71(local_f18.mseReferenceOutput.field_2._M_allocated_capacity._1_7_,
                             local_f18.mseReferenceOutput.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f18.mseReferenceImage._M_dataplus._M_p != &local_f18.mseReferenceImage.field_2) {
    operator_delete(local_f18.mseReferenceImage._M_dataplus._M_p,
                    CONCAT71(local_f18.mseReferenceImage.field_2._M_allocated_capacity._1_7_,
                             local_f18.mseReferenceImage.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f18.imageFile._M_dataplus._M_p != &local_f18.imageFile.field_2) {
    operator_delete(local_f18.imageFile._M_dataplus._M_p,
                    CONCAT71(local_f18.imageFile.field_2._M_allocated_capacity._1_7_,
                             local_f18.imageFile.field_2._M_local_buf[0]) + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
#ifdef NVTX
#ifdef PBRT_IS_WINDOWS
    nvtxNameOsThread(GetCurrentThreadId(), "MAIN_THREAD");
#else
    nvtxNameOsThread(syscall(SYS_gettid), "MAIN_THREAD");
#endif
#endif  // NVTX

    // Declare variables for parsed command line
    PBRTOptions options;
    std::vector<std::string> filenames;
    std::string logLevel = "error";
    std::string renderCoordSys = "cameraworld";
    bool format = false, toPly = false;

    // Process command-line arguments
    ++argv;
    while (*argv != nullptr) {
        if ((*argv)[0] != '-') {
            filenames.push_back(*argv);
            ++argv;
            continue;
        }

        auto onError = [](const std::string &err) {
            usage(err);
            exit(1);
        };

        std::string cropWindow, pixelBounds, pixel, pixelMaterial;
        if (ParseArg(&argv, "cropwindow", &cropWindow, onError)) {
            std::vector<Float> c = SplitStringToFloats(cropWindow, ',');
            if (c.size() != 4) {
                usage("Didn't find four values after --cropwindow");
                return 1;
            }
            options.cropWindow = Bounds2f(Point2f(c[0], c[2]), Point2f(c[1], c[3]));
        } else if (ParseArg(&argv, "pixel", &pixel, onError)) {
            std::vector<int> p = SplitStringToInts(pixel, ',');
            if (p.size() != 2) {
                usage("Didn't find two values after --pixel");
                return 1;
            }
            options.pixelBounds =
                Bounds2i(Point2i(p[0], p[1]), Point2i(p[0] + 1, p[1] + 1));
        } else if (ParseArg(&argv, "pixelbounds", &pixelBounds, onError)) {
            std::vector<int> p = SplitStringToInts(pixelBounds, ',');
            if (p.size() != 4) {
                usage("Didn't find four integer values after --pixelbounds");
                return 1;
            }
            options.pixelBounds = Bounds2i(Point2i(p[0], p[2]), Point2i(p[1], p[3]));
        } else if (ParseArg(&argv, "pixelmaterial", &pixelMaterial, onError)) {
            std::vector<int> p = SplitStringToInts(pixelMaterial, ',');
            if (p.size() != 2) {
                usage("Didn't find two values after --pixelmaterial");
                return 1;
            }
            options.pixelMaterial = Point2i(p[0], p[1]);
        } else if (
#ifdef PBRT_BUILD_GPU_RENDERER
            ParseArg(&argv, "gpu", &options.useGPU, onError) ||
            ParseArg(&argv, "gpu-device", &options.gpuDevice, onError) ||
#endif
            ParseArg(&argv, "debugstart", &options.debugStart, onError) ||
            ParseArg(&argv, "disable-pixel-jitter", &options.disablePixelJitter,
                     onError) ||
            ParseArg(&argv, "disable-wavelength-jitter", &options.disableWavelengthJitter,
                     onError) ||
            ParseArg(&argv, "display-server", &options.displayServer, onError) ||
            ParseArg(&argv, "force-diffuse", &options.forceDiffuse, onError) ||
            ParseArg(&argv, "format", &format, onError) ||
            ParseArg(&argv, "log-level", &logLevel, onError) ||
            ParseArg(&argv, "mse-reference-image", &options.mseReferenceImage, onError) ||
            ParseArg(&argv, "mse-reference-out", &options.mseReferenceOutput, onError) ||
            ParseArg(&argv, "nthreads", &options.nThreads, onError) ||
            ParseArg(&argv, "outfile", &options.imageFile, onError) ||
            ParseArg(&argv, "pixelstats", &options.recordPixelStatistics, onError) ||
            ParseArg(&argv, "quick", &options.quickRender, onError) ||
            ParseArg(&argv, "quiet", &options.quiet, onError) ||
            ParseArg(&argv, "render-coord-sys", &renderCoordSys, onError) ||
            ParseArg(&argv, "seed", &options.seed, onError) ||
            ParseArg(&argv, "spp", &options.pixelSamples, onError) ||
            ParseArg(&argv, "toply", &toPly, onError) ||
            ParseArg(&argv, "write-partial-images", &options.writePartialImages,
                     onError) ||
            ParseArg(&argv, "upgrade", &options.upgrade, onError)) {
            // success
        } else if ((strcmp(*argv, "--help") == 0) || (strcmp(*argv, "-help") == 0) ||
                   (strcmp(*argv, "-h") == 0)) {
            usage();
            return 0;
        } else {
            usage(StringPrintf("argument \"%s\" unknown", *argv));
            return 1;
        }
    }

    // Print welcome banner
    if (!options.quiet && !format && !toPly && !options.upgrade) {
        printf("pbrt version 4 (built %s at %s)\n", __DATE__, __TIME__);
#ifdef PBRT_DEBUG_BUILD
        LOG_VERBOSE("Running debug build");
        printf("*** DEBUG BUILD ***\n");
#endif
        printf("Copyright (c)1998-2020 Matt Pharr, Wenzel Jakob, and Greg Humphreys.\n");
        printf("The source code to pbrt (but *not* the book contents) is covered "
               "by the Apache 2.0 License.\n");
        printf("See the file LICENSE.txt for the conditions of the license.\n");
        fflush(stdout);
    }

    // Check validity of provided arguments
    if (renderCoordSys == "camera")
        options.renderingSpace = RenderingCoordinateSystem::Camera;
    else if (renderCoordSys == "cameraworld")
        options.renderingSpace = RenderingCoordinateSystem::CameraWorld;
    else if (renderCoordSys == "world")
        options.renderingSpace = RenderingCoordinateSystem::World;
    else
        ErrorExit("%s: unknown rendering coordinate system.", renderCoordSys);

    if (!options.mseReferenceImage.empty() && options.mseReferenceOutput.empty())
        ErrorExit("Must provide MSE reference output filename via "
                  "--mse-reference-out");
    if (!options.mseReferenceOutput.empty() && options.mseReferenceImage.empty())
        ErrorExit("Must provide MSE reference image via --mse-reference-image");

    if (options.pixelMaterial && options.useGPU) {
        Warning("Disabling --use-gpu since --pixelmaterial was specified.");
        options.useGPU = false;
    }

    options.logLevel = LogLevelFromString(logLevel);

    // Initialize pbrt
    InitPBRT(options);

    if (format || toPly || options.upgrade) {
        FormattingScene formattingScene(toPly, options.upgrade);
        ParseFiles(&formattingScene, filenames);
    } else {
        // Parse provided scene description files
        ParsedScene scene;
        ParseFiles(&scene, filenames);

        // Render the scene
        if (options.useGPU)
            GPURender(scene);
        else
            CPURender(scene);

        LOG_VERBOSE("Memory used after post-render cleanup: %s", GetCurrentRSS());
        // Clean up after rendering the scene
        CleanupPBRT();
    }
    return 0;
}